

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

ACT_TYPE __thiscall
despot::TagSHRPolicy::Action
          (TagSHRPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  Floor *pFVar1;
  OBS_TYPE OVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ACT_TYPE AVar6;
  undefined8 uVar7;
  vector<int,_std::allocator<int>_> actions;
  Coord rob;
  int local_5c;
  int *local_58;
  iterator iStack_50;
  int *local_48;
  undefined8 local_38;
  
  if (*(long *)(history + 8) == *(long *)history) {
    (**(code **)(*(long *)this->tag_model_ + 0x18))();
    AVar6 = despot::Random::NextInt(0x121170);
    return AVar6;
  }
  AVar6 = 4;
  if (*(OBS_TYPE *)(*(long *)(history + 0x20) + -8) != this->tag_model_->same_loc_obs_) {
    local_58 = (int *)0x0;
    iStack_50._M_current = (int *)0x0;
    local_48 = (int *)0x0;
    despot::Coord::Coord((Coord *)&local_38);
    OVar2 = this->tag_model_->same_loc_obs_;
    pFVar1 = &this->floor_;
    iVar5 = despot::Floor::NumCells();
    if (OVar2 == (long)iVar5) {
      local_38 = despot::Floor::GetCell((int)pFVar1);
    }
    else {
      local_38 = BaseTag::MostLikelyRobPosition(this->tag_model_,particles);
    }
    local_5c = 0;
    do {
      cVar4 = despot::Compass::Opposite(local_5c,*(int *)(*(long *)(history + 8) + -4));
      if (cVar4 == '\0') {
        uVar7 = despot::operator+((Coord *)&local_38,(Coord *)(&Compass::DIRECTIONS + local_5c));
        cVar4 = despot::Floor::Inside(pFVar1,uVar7);
        if (cVar4 != '\0') {
          if (iStack_50._M_current == local_48) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_58,iStack_50,&local_5c);
          }
          else {
            *iStack_50._M_current = local_5c;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
      iVar5 = local_5c + 1;
      bVar3 = local_5c < 3;
      local_5c = iVar5;
    } while (bVar3);
    if (iStack_50._M_current == local_58) {
      local_5c = 0;
      do {
        uVar7 = despot::operator+((Coord *)&local_38,(Coord *)(&Compass::DIRECTIONS + local_5c));
        cVar4 = despot::Floor::Inside(pFVar1,uVar7);
        if (cVar4 != '\0') {
          if (iStack_50._M_current == local_48) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_58,iStack_50,&local_5c);
          }
          else {
            *iStack_50._M_current = local_5c;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
        iVar5 = local_5c + 1;
        bVar3 = local_5c < 3;
        local_5c = iVar5;
      } while (bVar3);
    }
    if (iStack_50._M_current == local_58) {
      AVar6 = 0;
      if (local_58 == (int *)0x0) {
        return 0;
      }
    }
    else {
      iVar5 = despot::Random::NextInt(0x121170);
      AVar6 = local_58[iVar5];
    }
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return AVar6;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		// If history is empty then take a random move
		if (history.Size() == 0) {
			return Random::RANDOM.NextInt(tag_model_->NumActions() - 1);
		}

		// If we just saw an opponent then TAG
		if (history.LastObservation() == tag_model_->same_loc_obs_) {
			return tag_model_->TagAction();
		}

		vector<ACT_TYPE> actions;
		// Compute rob position
		Coord rob;
		if (tag_model_->same_loc_obs_ != floor_.NumCells()) {
			rob = tag_model_->MostLikelyRobPosition(particles);
		} else {
			rob = floor_.GetCell(history.LastObservation());
		}

		// Don't double back and don't go into walls
		for (int d = 0; d < 4; d++) {
			if (!Compass::Opposite(d, history.LastAction())
				&& floor_.Inside(rob + Compass::DIRECTIONS[d])) {
				actions.push_back(d);
			}
		}

		// Have to double back
		if (actions.size() == 0) {
			for (int d = 0; d < 4; d++) {
				if (floor_.Inside(rob + Compass::DIRECTIONS[d]))
					actions.push_back(d);
			}
		}

		// Rob may be trapped by the obstacles
		if (actions.size() == 0)
			return 0;

		ACT_TYPE action = actions[Random::RANDOM.NextInt(actions.size())];
		return action;
	}